

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrGLContext.cpp
# Opt level: O2

void __thiscall sglr::GLContext::deleteBuffers(GLContext *this,int numBuffers,deUint32 *buffers)

{
  ulong uVar1;
  bool bVar2;
  
  glu::CallLogWrapper::glDeleteBuffers(this->m_wrapper,numBuffers,buffers);
  uVar1 = 0;
  if (0 < numBuffers) {
    uVar1 = (ulong)(uint)numBuffers;
  }
  while (bVar2 = uVar1 != 0, uVar1 = uVar1 - 1, bVar2) {
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::erase(&(this->m_allocatedBuffers)._M_t,buffers);
    buffers = buffers + 1;
  }
  return;
}

Assistant:

void GLContext::deleteBuffers (int numBuffers, const deUint32* buffers)
{
	m_wrapper->glDeleteBuffers(numBuffers, buffers);
	for (int i = 0; i < numBuffers; i++)
		m_allocatedBuffers.erase(buffers[i]);
}